

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

Float __thiscall pbrt::Triangle::SolidAngle(Triangle *this,Point3f *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Float FVar7;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  Vector3<float> VVar8;
  Vector3f *in_stack_00000018;
  Vector3f *in_stack_00000020;
  Vector3f *in_stack_00000028;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  int *v;
  TriangleMesh *mesh;
  Point3<float> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  
  GetMesh((Triangle *)0x7e2069);
  VVar8 = Point3<float>::operator-
                    ((Point3<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffef8);
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  vmovlpd_avx(auVar1);
  VVar8 = Normalize<float>((Vector3<float> *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  auVar2._8_8_ = extraout_XMM0_Qb_00;
  auVar2._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  vmovlpd_avx(auVar2);
  VVar8 = Point3<float>::operator-
                    ((Point3<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffef8);
  auVar3._8_8_ = extraout_XMM0_Qb_01;
  auVar3._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  vmovlpd_avx(auVar3);
  VVar8 = Normalize<float>((Vector3<float> *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  auVar4._8_8_ = extraout_XMM0_Qb_02;
  auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  vmovlpd_avx(auVar4);
  VVar8 = Point3<float>::operator-
                    ((Point3<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffef8);
  auVar5._8_8_ = extraout_XMM0_Qb_03;
  auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  vmovlpd_avx(auVar5);
  VVar8 = Normalize<float>((Vector3<float> *)
                           CONCAT44(in_stack_ffffffffffffff14,
                                    VVar8.super_Tuple3<pbrt::Vector3,_float>.z));
  auVar6._8_8_ = extraout_XMM0_Qb_04;
  auVar6._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  vmovlpd_avx(auVar6);
  FVar7 = SphericalTriangleArea(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  return FVar7;
}

Assistant:

PBRT_CPU_GPU
    Float SolidAngle(const Point3f &p) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        return SphericalTriangleArea(Normalize(p0 - p), Normalize(p1 - p),
                                     Normalize(p2 - p));
    }